

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  bool bVar1;
  const_iterator cVar2;
  pointer pbVar3;
  bool bVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string local_d0;
  size_type local_b0;
  pointer local_a8;
  undefined8 local_a0;
  char *local_98;
  string *local_90;
  pointer local_88;
  string local_80;
  string local_50;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->IgnoredPaths)._M_t,dir);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header)
  {
    pbVar3 = (this->Configs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = (this->Configs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != local_88;
    if (bVar4) {
      local_90 = (string *)&this->DebugBuffer;
      do {
        local_d0._M_string_length = (size_type)(dir->_M_dataplus)._M_p;
        local_d0._M_dataplus._M_p = (pointer)dir->_M_string_length;
        local_80._M_dataplus._M_p = &DAT_00000001;
        local_d0.field_2._8_8_ = &local_80.field_2;
        local_80.field_2._M_local_buf[0] = '/';
        local_d0.field_2._M_allocated_capacity = 1;
        local_a8 = (pbVar3->_M_dataplus)._M_p;
        local_b0 = pbVar3->_M_string_length;
        views._M_len = 3;
        views._M_array = (iterator)&local_d0;
        local_80._M_string_length = local_d0.field_2._8_8_;
        cmCatViews_abi_cxx11_(&local_50,views);
        std::__cxx11::string::operator=((string *)file,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((this->super_cmFindCommon).DebugMode == true) {
          local_d0._M_string_length = (size_type)(this->DebugBuffer)._M_dataplus._M_p;
          local_d0._M_dataplus._M_p = (pointer)(this->DebugBuffer)._M_string_length;
          local_d0.field_2._M_allocated_capacity = 2;
          local_d0.field_2._8_8_ =
               (long)"RPATH_REMOVE could not remove RPATH from file: \n  " + 0x30;
          local_a8 = (file->_M_dataplus)._M_p;
          local_b0 = file->_M_string_length;
          local_a0 = 1;
          local_98 = "\n";
          views_00._M_len = 4;
          views_00._M_array = (iterator)&local_d0;
          cmCatViews_abi_cxx11_(&local_80,views_00);
          std::__cxx11::string::operator=(local_90,(string *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
        }
        bVar1 = cmsys::SystemTools::FileExists(file,true);
        if ((bVar1) && (bVar1 = CheckVersion(this,file), bVar1)) {
          if (this->UseRealPath != true) {
            return bVar4;
          }
          cmsys::SystemTools::GetRealPath(&local_d0,file,(string *)0x0);
          std::__cxx11::string::operator=((string *)file,(string *)&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
            return bVar4;
          }
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          return bVar4;
        }
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != local_88;
      } while (bVar4);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir)) {
    return false;
  }

  for (std::string const& c : this->Configs) {
    file = cmStrCat(dir, '/', c);
    if (this->DebugMode) {
      this->DebugBuffer = cmStrCat(this->DebugBuffer, "  ", file, "\n");
    }
    if (cmSystemTools::FileExists(file, true) && this->CheckVersion(file)) {
      // Allow resolving symlinks when the config file is found through a link
      if (this->UseRealPath) {
        file = cmSystemTools::GetRealPath(file);
      }
      return true;
    }
  }
  return false;
}